

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_6340f::OpenXrProgram::CreateSwapchains(OpenXrProgram *this)

{
  pointer *ppSVar1;
  element_type *peVar2;
  ulong uVar3;
  pointer pXVar4;
  iterator __position;
  bool bVar5;
  uint uVar6;
  XrResult XVar7;
  int iVar8;
  undefined4 extraout_var;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  uint __len;
  ulong __val;
  vector<Swapchain,std::allocator<Swapchain>> *pvVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint32_t viewCount;
  uint32_t swapchainFormatCount;
  string swapchainFormatsString;
  string __str;
  uint32_t imageCount;
  vector<long,_std::allocator<long>_> swapchainFormats;
  Swapchain swapchain;
  vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
  swapchainImages;
  XrSystemProperties systemProperties;
  uint local_2d0;
  uint local_2cc;
  value_type local_2c8;
  string local_288;
  uint local_264;
  vector<Swapchain,std::allocator<Swapchain>> *local_260;
  vector<Swapchain,std::allocator<Swapchain>> *local_258;
  vector<long,_std::allocator<long>_> local_250;
  Swapchain local_238;
  pointer local_228;
  size_type sStack_220;
  long lStack_218;
  OpenXrProgram *local_210;
  vector<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_> *local_208;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  undefined4 local_160 [6];
  uint local_148;
  undefined1 local_144 [256];
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  if (this->m_session == (XrSession)0x0) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"Check failed","");
    Throw(&local_180,"m_session != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:576"
         );
  }
  if ((this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Check failed","");
    Throw(&local_1a0,"m_swapchains.empty()",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:577"
         );
  }
  if ((this->m_configViews).
      super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_configViews).
      super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Check failed","");
    Throw(&local_1c0,"m_configViews.empty()",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:578"
         );
  }
  memset(local_160,0,0x130);
  local_160[0] = 5;
  XVar7 = xrGetSystemProperties(this->m_instance,this->m_systemId,local_160);
  if (XVar7 < XR_SUCCESS) {
    pcVar11 = "xrGetSystemProperties(m_instance, m_systemId, &systemProperties)";
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:582"
    ;
  }
  else {
    Fmt_abi_cxx11_((string *)&local_2c8,"System Properties: Name=%s VendorId=%d",local_144,
                   (ulong)local_148);
    Log::Write(Info,(string *)&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_2c8.pose) {
      operator_delete((void *)local_2c8._0_8_,local_2c8.pose.orientation._0_8_ + 1);
    }
    Fmt_abi_cxx11_((string *)&local_2c8,
                   "System Graphics Properties: MaxWidth=%d MaxHeight=%d MaxLayers=%d",
                   (ulong)local_40,(ulong)local_44,(ulong)local_3c);
    Log::Write(Info,(string *)&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_2c8.pose) {
      operator_delete((void *)local_2c8._0_8_,local_2c8.pose.orientation._0_8_ + 1);
    }
    pcVar9 = "False";
    pcVar11 = "False";
    if (local_38 == 1) {
      pcVar11 = "True";
    }
    if (local_34 == 1) {
      pcVar9 = "True";
    }
    Fmt_abi_cxx11_((string *)&local_2c8,
                   "System Tracking Properties: OrientationTracking=%s PositionTracking=%s",pcVar11,
                   pcVar9);
    Log::Write(Info,(string *)&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_2c8.pose) {
      operator_delete((void *)local_2c8._0_8_,local_2c8.pose.orientation._0_8_ + 1);
    }
    if ((((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        Parsed).ViewConfigType != XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO) {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"Unsupported view configuration type","");
      Throw(&local_1e0,
            "m_options->Parsed.ViewConfigType == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO",
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:599"
           );
    }
    XVar7 = xrEnumerateViewConfigurationViews(this->m_instance,this->m_systemId,2,0,&local_2d0,0);
    if (XVar7 < XR_SUCCESS) {
      pcVar11 = 
      "xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &viewCount, nullptr)"
      ;
      pcVar9 = 
      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:604"
      ;
    }
    else {
      local_208 = &this->m_configViews;
      local_2c8.next = (void *)0x0;
      local_2c8.pose.orientation.x = 0.0;
      local_2c8.pose.orientation.y = 0.0;
      local_2c8.pose.orientation.z = 0.0;
      local_2c8.pose.orientation.w = 0.0;
      local_2c8.pose.position.x = 0.0;
      local_2c8.pose.position.y = 0.0;
      local_2c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x29;
      std::vector<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>::resize
                (local_208,(ulong)local_2d0,(value_type *)&local_2c8);
      XVar7 = xrEnumerateViewConfigurationViews
                        (this->m_instance,this->m_systemId,
                         (((this->m_options).
                           super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         Parsed).ViewConfigType,local_2d0,&local_2d0,
                         (this->m_configViews).
                         super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (XR_ERROR_VALIDATION_FAILURE < XVar7) {
        local_2c8.next = (void *)0x0;
        local_2c8.fov.angleRight = 0.0;
        local_2c8.fov.angleUp = 0.0;
        local_2c8.fov.angleDown = 0.0;
        local_2c8._60_4_ = 0;
        local_2c8.pose.position.x = 0.0;
        local_2c8.pose.position.y = 0.0;
        local_2c8.pose.position.z = 0.0;
        local_2c8.fov.angleLeft = 0.0;
        local_2c8.pose.orientation.x = 0.0;
        local_2c8.pose.orientation.y = 0.0;
        local_2c8.pose.orientation.z = 0.0;
        local_2c8.pose.orientation.w = 0.0;
        local_2c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x7;
        std::vector<XrView,_std::allocator<XrView>_>::resize
                  (&this->m_views,(ulong)local_2d0,&local_2c8);
        if (local_2d0 != 0) {
          XVar7 = xrEnumerateSwapchainFormats(this->m_session,0,&local_2cc,0);
          if (XVar7 < XR_SUCCESS) {
            pcVar11 = "xrEnumerateSwapchainFormats(m_session, 0, &swapchainFormatCount, nullptr)";
            pcVar9 = 
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:616"
            ;
            goto LAB_00110201;
          }
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_250,(ulong)local_2cc,(allocator_type *)&local_2c8);
          XVar7 = xrEnumerateSwapchainFormats
                            (this->m_session,
                             (ulong)((long)local_250.super__Vector_base<long,_std::allocator<long>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_250.super__Vector_base<long,_std::allocator<long>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3,&local_2cc)
          ;
          if (XVar7 < XR_SUCCESS) {
            ThrowXrResult(XVar7,
                          "xrEnumerateSwapchainFormats(m_session, (uint32_t)swapchainFormats.size(), &swapchainFormatCount, swapchainFormats.data())"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:619"
                         );
          }
          if ((long)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3 != (ulong)local_2cc) {
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Check failed","");
            Throw(&local_200,"swapchainFormatCount == swapchainFormats.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:620"
                 );
          }
          peVar2 = (this->m_graphicsPlugin).
                   super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar8 = (*peVar2->_vptr_IGraphicsPlugin[4])(peVar2,&local_250);
          this->m_colorSwapchainFormat = CONCAT44(extraout_var,iVar8);
          local_2c8._0_8_ = &local_2c8.pose;
          local_2c8.next = (void *)0x0;
          local_2c8.pose.orientation._0_8_ = local_2c8.pose.orientation._0_8_ & 0xffffffffffffff00;
          local_260 = (vector<Swapchain,std::allocator<Swapchain>> *)
                      local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          if (local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pvVar12 = (vector<Swapchain,std::allocator<Swapchain>> *)
                      local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_210 = this;
            do {
              uVar13 = *(ulong *)pvVar12;
              uVar3 = local_210->m_colorSwapchainFormat;
              std::__cxx11::string::append((char *)&local_2c8);
              if (uVar13 == uVar3) {
                std::__cxx11::string::append((char *)&local_2c8);
              }
              __val = -uVar13;
              if (0 < (long)uVar13) {
                __val = uVar13;
              }
              __len = 1;
              if (9 < __val) {
                uVar10 = __val;
                uVar6 = 4;
                do {
                  __len = uVar6;
                  if (uVar10 < 100) {
                    __len = __len - 2;
                    goto LAB_0010fd1a;
                  }
                  if (uVar10 < 1000) {
                    __len = __len - 1;
                    goto LAB_0010fd1a;
                  }
                  if (uVar10 < 10000) goto LAB_0010fd1a;
                  bVar5 = 99999 < uVar10;
                  uVar10 = uVar10 / 10000;
                  uVar6 = __len + 4;
                } while (bVar5);
                __len = __len + 1;
              }
LAB_0010fd1a:
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              local_258 = pvVar12;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_288,(char)__len - (char)((long)uVar13 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_288._M_dataplus._M_p + -((long)uVar13 >> 0x3f),__len,__val);
              std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_288._M_dataplus._M_p);
              pvVar12 = local_258;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                local_288.field_2._M_allocated_capacity + 1);
              }
              if (uVar13 == uVar3) {
                std::__cxx11::string::append((char *)&local_2c8);
              }
              pvVar12 = pvVar12 + 8;
              this = local_210;
            } while (pvVar12 != local_260);
          }
          Fmt_abi_cxx11_(&local_288,"Swapchain Formats: %s",local_2c8._0_8_);
          Log::Write(Verbose,&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_2c8.pose) {
            operator_delete((void *)local_2c8._0_8_,local_2c8.pose.orientation._0_8_ + 1);
          }
          if (local_2d0 != 0) {
            local_260 = (vector<Swapchain,std::allocator<Swapchain>> *)&this->m_swapchains;
            local_258 = (vector<Swapchain,std::allocator<Swapchain>> *)&this->m_swapchainImages;
            lVar14 = 0;
            uVar13 = 0;
            do {
              pXVar4 = (local_208->
                       super__Vector_base<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              Fmt_abi_cxx11_((string *)&local_2c8,
                             "Creating swapchain for view %d with dimensions Width=%d Height=%d SampleCount=%d"
                             ,uVar13 & 0xffffffff,
                             (ulong)*(uint *)((long)&pXVar4->recommendedImageRectWidth + lVar14),
                             (ulong)*(uint *)((long)&pXVar4->recommendedImageRectHeight + lVar14),
                             (ulong)*(uint *)((long)&pXVar4->recommendedSwapchainSampleCount +
                                             lVar14));
              Log::Write(Info,(string *)&local_2c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_2c8.pose) {
                operator_delete((void *)local_2c8._0_8_,local_2c8.pose.orientation._0_8_ + 1);
              }
              lVar15 = (long)&pXVar4->type + lVar14;
              local_2c8.next = (void *)0x0;
              local_2c8.pose.position.z = 0.0;
              local_2c8.pose.orientation.x = 0.0;
              local_2c8.pose.orientation.y = 0.0;
              local_2c8.pose.orientation.z = 0.0;
              local_2c8.pose.orientation.w = 0.0;
              local_2c8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x9;
              local_2c8.pose.position._0_8_ = this->m_colorSwapchainFormat;
              local_2c8.fov.angleLeft = *(float *)(lVar15 + 0x10);
              local_2c8.fov.angleRight = *(float *)(lVar15 + 0x18);
              local_2c8.fov.angleDown = 1.4013e-45;
              local_2c8._60_4_ = 1;
              local_2c8.fov.angleUp = 1.4013e-45;
              peVar2 = (this->m_graphicsPlugin).
                       super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_2c8.pose.position.z = (float)(*peVar2->_vptr_IGraphicsPlugin[8])(peVar2,lVar15);
              local_2c8.pose.orientation.z = 4.62428e-44;
              local_2c8.pose.orientation.w = 0.0;
              local_238.height = (int32_t)local_2c8.fov.angleRight;
              local_238.width = (int32_t)local_2c8.fov.angleLeft;
              XVar7 = xrCreateSwapchain(this->m_session,(string *)&local_2c8,&local_238);
              if (XVar7 < XR_SUCCESS) {
                ThrowXrResult(XVar7,
                              "xrCreateSwapchain(m_session, &swapchainCreateInfo, &swapchain.handle)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:660"
                             );
              }
              __position._M_current =
                   (this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->m_swapchains).super__Vector_base<Swapchain,_std::allocator<Swapchain>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Swapchain,std::allocator<Swapchain>>::
                _M_realloc_insert<Swapchain_const&>(local_260,__position,&local_238);
              }
              else {
                *(undefined4 *)&(__position._M_current)->handle = local_238.handle._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->handle + 4) = local_238.handle._4_4_
                ;
                (__position._M_current)->width = local_238.width;
                (__position._M_current)->height = local_238.height;
                ppSVar1 = &(this->m_swapchains).
                           super__Vector_base<Swapchain,_std::allocator<Swapchain>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + 1;
              }
              XVar7 = xrEnumerateSwapchainImages
                                (CONCAT44(local_238.handle._4_4_,local_238.handle._0_4_),0,
                                 &local_264,0);
              if (XVar7 < XR_SUCCESS) {
                ThrowXrResult(XVar7,
                              "xrEnumerateSwapchainImages(swapchain.handle, 0, &imageCount, nullptr)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:665"
                             );
              }
              peVar2 = (this->m_graphicsPlugin).
                       super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (*peVar2->_vptr_IGraphicsPlugin[6])
                        (&local_228,peVar2,(ulong)local_264,(string *)&local_2c8);
              XVar7 = xrEnumerateSwapchainImages
                                (CONCAT44(local_238.handle._4_4_,local_238.handle._0_4_),local_264,
                                 &local_264,*local_228);
              if (XVar7 < XR_SUCCESS) {
                ThrowXrResult(XVar7,
                              "xrEnumerateSwapchainImages(swapchain.handle, imageCount, &imageCount, swapchainImages[0])"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:669"
                             );
              }
              local_288._M_dataplus._M_p =
                   (pointer)CONCAT44(local_238.handle._4_4_,local_238.handle._0_4_);
              local_288._M_string_length = (size_type)local_228;
              local_288.field_2._M_allocated_capacity = sStack_220;
              local_288.field_2._8_8_ = lStack_218;
              local_228 = (pointer)0x0;
              sStack_220 = 0;
              lStack_218 = 0;
              std::
              _Rb_tree<XrSwapchain_T*,std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>,std::_Select1st<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>,std::less<XrSwapchain_T*>,std::allocator<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>>
              ::
              _M_emplace_unique<std::pair<XrSwapchain_T*,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>
                        ((_Rb_tree<XrSwapchain_T*,std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>,std::_Select1st<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>,std::less<XrSwapchain_T*>,std::allocator<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>>
                          *)local_258,
                         (pair<XrSwapchain_T_*,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>_>
                          *)&local_288);
              if ((pointer)local_288._M_string_length != (pointer)0x0) {
                operator_delete((void *)local_288._M_string_length,
                                local_288.field_2._8_8_ - local_288._M_string_length);
              }
              if (local_228 != (pointer)0x0) {
                operator_delete(local_228,lStack_218 - (long)local_228);
              }
              uVar13 = uVar13 + 1;
              lVar14 = lVar14 + 0x28;
            } while (uVar13 < local_2d0);
          }
          if ((vector<Swapchain,std::allocator<Swapchain>> *)
              local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (vector<Swapchain,std::allocator<Swapchain>> *)0x0
             ) {
            operator_delete(local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        return;
      }
      pcVar11 = 
      "xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, viewCount, &viewCount, m_configViews.data())"
      ;
      pcVar9 = 
      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:607"
      ;
    }
  }
LAB_00110201:
  ThrowXrResult(XVar7,pcVar11,pcVar9);
}

Assistant:

void CreateSwapchains() override {
        CHECK(m_session != XR_NULL_HANDLE);
        CHECK(m_swapchains.empty());
        CHECK(m_configViews.empty());

        // Read graphics properties for preferred swapchain length and logging.
        XrSystemProperties systemProperties{XR_TYPE_SYSTEM_PROPERTIES};
        CHECK_XRCMD(xrGetSystemProperties(m_instance, m_systemId, &systemProperties));

        // Log system properties.
        Log::Write(Log::Level::Info,
                   Fmt("System Properties: Name=%s VendorId=%d", systemProperties.systemName, systemProperties.vendorId));
        Log::Write(Log::Level::Info, Fmt("System Graphics Properties: MaxWidth=%d MaxHeight=%d MaxLayers=%d",
                                         systemProperties.graphicsProperties.maxSwapchainImageWidth,
                                         systemProperties.graphicsProperties.maxSwapchainImageHeight,
                                         systemProperties.graphicsProperties.maxLayerCount));
        Log::Write(Log::Level::Info, Fmt("System Tracking Properties: OrientationTracking=%s PositionTracking=%s",
                                         systemProperties.trackingProperties.orientationTracking == XR_TRUE ? "True" : "False",
                                         systemProperties.trackingProperties.positionTracking == XR_TRUE ? "True" : "False"));

        // Note: No other view configurations exist at the time this code was written. If this
        // condition is not met, the project will need to be audited to see how support should be
        // added.
        CHECK_MSG(m_options->Parsed.ViewConfigType == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO,
                  "Unsupported view configuration type");

        // Query and cache view configuration views.
        uint32_t viewCount;
        CHECK_XRCMD(
            xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &viewCount, nullptr));
        m_configViews.resize(viewCount, {XR_TYPE_VIEW_CONFIGURATION_VIEW});
        CHECK_XRCMD(xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, viewCount,
                                                      &viewCount, m_configViews.data()));

        // Create and cache view buffer for xrLocateViews later.
        m_views.resize(viewCount, {XR_TYPE_VIEW});

        // Create the swapchain and get the images.
        if (viewCount > 0) {
            // Select a swapchain format.
            uint32_t swapchainFormatCount;
            CHECK_XRCMD(xrEnumerateSwapchainFormats(m_session, 0, &swapchainFormatCount, nullptr));
            std::vector<int64_t> swapchainFormats(swapchainFormatCount);
            CHECK_XRCMD(xrEnumerateSwapchainFormats(m_session, (uint32_t)swapchainFormats.size(), &swapchainFormatCount,
                                                    swapchainFormats.data()));
            CHECK(swapchainFormatCount == swapchainFormats.size());
            m_colorSwapchainFormat = m_graphicsPlugin->SelectColorSwapchainFormat(swapchainFormats);

            // Print swapchain formats and the selected one.
            {
                std::string swapchainFormatsString;
                for (int64_t format : swapchainFormats) {
                    const bool selected = format == m_colorSwapchainFormat;
                    swapchainFormatsString += " ";
                    if (selected) {
                        swapchainFormatsString += "[";
                    }
                    swapchainFormatsString += std::to_string(format);
                    if (selected) {
                        swapchainFormatsString += "]";
                    }
                }
                Log::Write(Log::Level::Verbose, Fmt("Swapchain Formats: %s", swapchainFormatsString.c_str()));
            }

            // Create a swapchain for each view.
            for (uint32_t i = 0; i < viewCount; i++) {
                const XrViewConfigurationView& vp = m_configViews[i];
                Log::Write(Log::Level::Info,
                           Fmt("Creating swapchain for view %d with dimensions Width=%d Height=%d SampleCount=%d", i,
                               vp.recommendedImageRectWidth, vp.recommendedImageRectHeight, vp.recommendedSwapchainSampleCount));

                // Create the swapchain.
                XrSwapchainCreateInfo swapchainCreateInfo{XR_TYPE_SWAPCHAIN_CREATE_INFO};
                swapchainCreateInfo.arraySize = 1;
                swapchainCreateInfo.format = m_colorSwapchainFormat;
                swapchainCreateInfo.width = vp.recommendedImageRectWidth;
                swapchainCreateInfo.height = vp.recommendedImageRectHeight;
                swapchainCreateInfo.mipCount = 1;
                swapchainCreateInfo.faceCount = 1;
                swapchainCreateInfo.sampleCount = m_graphicsPlugin->GetSupportedSwapchainSampleCount(vp);
                swapchainCreateInfo.usageFlags = XR_SWAPCHAIN_USAGE_SAMPLED_BIT | XR_SWAPCHAIN_USAGE_COLOR_ATTACHMENT_BIT;
                Swapchain swapchain;
                swapchain.width = swapchainCreateInfo.width;
                swapchain.height = swapchainCreateInfo.height;
                CHECK_XRCMD(xrCreateSwapchain(m_session, &swapchainCreateInfo, &swapchain.handle));

                m_swapchains.push_back(swapchain);

                uint32_t imageCount;
                CHECK_XRCMD(xrEnumerateSwapchainImages(swapchain.handle, 0, &imageCount, nullptr));
                // XXX This should really just return XrSwapchainImageBaseHeader*
                std::vector<XrSwapchainImageBaseHeader*> swapchainImages =
                    m_graphicsPlugin->AllocateSwapchainImageStructs(imageCount, swapchainCreateInfo);
                CHECK_XRCMD(xrEnumerateSwapchainImages(swapchain.handle, imageCount, &imageCount, swapchainImages[0]));

                m_swapchainImages.insert(std::make_pair(swapchain.handle, std::move(swapchainImages)));
            }
        }
    }